

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O2

void duckdb_je_tcache_arena_associate
               (tsdn_t *tsdn,tcache_slow_t *tcache_slow,tcache_t *tcache,arena_t *arena)

{
  tcache_slow_t *ptVar1;
  cache_bin_array_descriptor_t *pcVar2;
  cache_bin_array_descriptor_t *pcVar3;
  cache_bin_array_descriptor_t *pcVar4;
  tcache_slow_t *ptVar5;
  
  tcache_slow->arena = arena;
  malloc_mutex_lock(tsdn,&arena->tcache_ql_mtx);
  (tcache_slow->link).qre_next = tcache_slow;
  (tcache_slow->link).qre_prev = tcache_slow;
  ptVar1 = (arena->tcache_ql).qlh_first;
  ptVar5 = tcache_slow;
  if (ptVar1 != (tcache_slow_t *)0x0) {
    (tcache_slow->link).qre_next = (ptVar1->link).qre_prev;
    (ptVar1->link).qre_prev = tcache_slow;
    ptVar5 = (((tcache_slow->link).qre_prev)->link).qre_next;
    (tcache_slow->link).qre_prev = ptVar5;
    (((ptVar1->link).qre_prev)->link).qre_next = ptVar1;
    (ptVar5->link).qre_next = tcache_slow;
    ptVar5 = (tcache_slow->link).qre_next;
  }
  (arena->tcache_ql).qlh_first = ptVar5;
  pcVar4 = &tcache_slow->cache_bin_array_descriptor;
  (tcache_slow->cache_bin_array_descriptor).link.qre_next = pcVar4;
  (tcache_slow->cache_bin_array_descriptor).link.qre_prev = pcVar4;
  (tcache_slow->cache_bin_array_descriptor).bins = tcache->bins;
  pcVar2 = (arena->cache_bin_array_descriptor_ql).qlh_first;
  if (pcVar2 != (cache_bin_array_descriptor_t *)0x0) {
    (tcache_slow->cache_bin_array_descriptor).link.qre_next = (pcVar2->link).qre_prev;
    (pcVar2->link).qre_prev = pcVar4;
    pcVar3 = (((tcache_slow->cache_bin_array_descriptor).link.qre_prev)->link).qre_next;
    (tcache_slow->cache_bin_array_descriptor).link.qre_prev = pcVar3;
    (((pcVar2->link).qre_prev)->link).qre_next = pcVar2;
    (pcVar3->link).qre_next = pcVar4;
    pcVar4 = (tcache_slow->cache_bin_array_descriptor).link.qre_next;
  }
  (arena->cache_bin_array_descriptor_ql).qlh_first = pcVar4;
  (arena->tcache_ql_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x48));
  return;
}

Assistant:

void
tcache_arena_associate(tsdn_t *tsdn, tcache_slow_t *tcache_slow,
    tcache_t *tcache, arena_t *arena) {
	assert(tcache_slow->arena == NULL);
	tcache_slow->arena = arena;

	if (config_stats) {
		/* Link into list of extant tcaches. */
		malloc_mutex_lock(tsdn, &arena->tcache_ql_mtx);

		ql_elm_new(tcache_slow, link);
		ql_tail_insert(&arena->tcache_ql, tcache_slow, link);
		cache_bin_array_descriptor_init(
		    &tcache_slow->cache_bin_array_descriptor, tcache->bins);
		ql_tail_insert(&arena->cache_bin_array_descriptor_ql,
		    &tcache_slow->cache_bin_array_descriptor, link);

		malloc_mutex_unlock(tsdn, &arena->tcache_ql_mtx);
	}
}